

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgets.c
# Opt level: O2

char * fgets(char *__s,int __n,FILE *__stream)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (__n == 0) {
    __s = (char *)0x0;
  }
  else if (__n == 1) {
    *__s = '\0';
  }
  else {
    mtx_lock((mtx_t *)&__stream->_IO_save_base);
    iVar3 = _PDCLIB_prepread((_PDCLIB_file_t *)__stream);
    pcVar5 = __s;
    if (iVar3 != -1) {
      do {
        pcVar4 = __stream->_IO_buf_base;
        if (__stream->_IO_read_base == __stream->_IO_write_base) {
          if (pcVar4 == (char *)0x0) {
            iVar3 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__stream);
            if (iVar3 != -1) {
              pcVar4 = __stream->_IO_buf_base;
              goto LAB_001032cf;
            }
            break;
          }
LAB_001032d4:
          __stream->_IO_buf_base = pcVar4 + -1;
          pcVar4 = pcVar4 + (long)__stream + 0x3f;
        }
        else {
LAB_001032cf:
          if (pcVar4 != (char *)0x0) goto LAB_001032d4;
          pcVar4 = __stream->_IO_read_base;
          __stream->_IO_read_base = pcVar4 + 1;
          pcVar4 = pcVar4 + (long)__stream->_IO_read_ptr;
        }
        cVar1 = *pcVar4;
        *pcVar5 = cVar1;
        pcVar5 = pcVar5 + 1;
        if ((cVar1 == '\n') || (bVar2 = __n < 2, __n = __n + -1, bVar2)) break;
      } while( true );
    }
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    *pcVar5 = '\0';
    if (pcVar5 == __s) {
      __s = (char *)0x0;
    }
  }
  return __s;
}

Assistant:

char * fgets( char * _PDCLIB_restrict s, int size, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    char * dest = s;

    if ( size == 0 )
    {
        return NULL;
    }

    if ( size == 1 )
    {
        *s = '\0';
        return s;
    }

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) != EOF )
    {
        do
        {
            if ( _PDCLIB_CHECKBUFFER( stream ) == EOF )
            {
                /* In case of error / EOF before a character is read, this
                   will lead to a \0 be written anyway. Since the results
                   are "indeterminate" by definition, this does not hurt.
                */
                break;
            }
        }
        while ( ( ( *dest++ = _PDCLIB_GETC( stream ) ) != '\n' ) && ( --size > 0 ) );
    }

    _PDCLIB_UNLOCK( stream->mtx );

    *dest = '\0';
    return ( dest == s ) ? NULL : s;
}